

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

uint64_t LD_AwareHash(uchar *data,uint64_t n,uint64_t hash,uint64_t scale,uint64_t hardener)

{
  uint64_t hardener_local;
  uint64_t scale_local;
  uint64_t hash_local;
  uint64_t n_local;
  uchar *data_local;
  
  hash_local = hash;
  data_local = data;
  for (n_local = n; n_local != 0; n_local = n_local - 1) {
    hash_local = (ulong)*data_local + scale * hash_local;
    data_local = data_local + 1;
  }
  return hash_local ^ hardener;
}

Assistant:

uint64_t LD_AwareHash(unsigned char* data, uint64_t n,
	uint64_t hash, uint64_t scale, uint64_t hardener) {
	while (n) {
		hash *= scale;
		hash += *data++;
		n--;
	}
	return hash ^ hardener;
}